

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall YAJLImage::scan_markers(YAJLImage *this)

{
  ssize_t sVar1;
  ostream *poVar2;
  size_t in_RCX;
  void *in_RDX;
  YAJLImage *local_10;
  
  sVar1 = bitio::bitio_stream::read(this->bstream,0x10,in_RDX,in_RCX);
  if (sVar1 == 0xffd8) {
    local_10 = this;
    std::vector<YAJLFrame,std::allocator<YAJLFrame>>::
    emplace_back<YAJLMiscData*,bitio::bitio_stream*&>
              ((vector<YAJLFrame,std::allocator<YAJLFrame>> *)
               &(this->super_YAJLImageDescriptor).frames,(YAJLMiscData **)&local_10,&this->bstream);
    printf(anon_var_dwarf_b767,
           "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/image.cpp"
          );
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"SOI not found");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void YAJLImage::scan_markers() {
    // First check for SOI marker
    if (bstream->read(0x10) != markers::SOI) {
        std::cout << "SOI not found" << std::endl;
        return;
    }
    // parse one frame
    frames.emplace_back(&misc, bstream);
#ifdef DEBUG
    printf("Run completed at: %s for 'Image'\n", __FILE__);
#endif
}